

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O2

void av1_superres_post_encode(AV1_COMP *cpi)

{
  uint8_t uVar1;
  int height;
  SequenceHeader *pSVar2;
  _Bool _Var3;
  int iVar4;
  YV12_BUFFER_CONFIG *ybf;
  
  av1_superres_upscale(&cpi->common,(BufferPool *)0x0,cpi->alloc_pyramid);
  iVar4 = (cpi->common).superres_upscaled_width;
  height = (cpi->common).superres_upscaled_height;
  if ((iVar4 == (cpi->common).render_width) && (height == (cpi->common).render_height)) {
    cpi->source = cpi->unscaled_source;
    if (cpi->last_source != (YV12_BUFFER_CONFIG *)0x0) {
      cpi->last_source = cpi->unscaled_last_source;
    }
  }
  else {
    pSVar2 = (cpi->common).seq_params;
    uVar1 = pSVar2->monochrome;
    ybf = cpi->unscaled_source;
    if (((ybf->field_2).field_0.y_crop_width != iVar4) ||
       ((ybf->field_3).field_0.y_crop_height != height)) {
      ybf = &cpi->scaled_source;
      iVar4 = aom_realloc_frame_buffer
                        (ybf,iVar4,height,pSVar2->subsampling_x,pSVar2->subsampling_y,
                         (uint)pSVar2->use_highbitdepth,0x120,(cpi->common).features.byte_alignment,
                         (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,
                         (void *)0x0,cpi->alloc_pyramid,0);
      if (iVar4 != 0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to reallocate scaled source buffer");
      }
      _Var3 = av1_resize_and_extend_frame_nonnormative
                        (cpi->unscaled_source,ybf,((cpi->common).seq_params)->bit_depth,
                         (uint)(uVar1 == '\0') * 2 + 1);
      if (!_Var3) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to reallocate buffers during resize");
      }
    }
    cpi->source = ybf;
  }
  return;
}

Assistant:

void av1_superres_post_encode(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;

  assert(cpi->oxcf.superres_cfg.enable_superres);
  assert(!is_lossless_requested(&cpi->oxcf.rc_cfg));
  assert(!cm->features.all_lossless);

  av1_superres_upscale(cm, NULL, cpi->alloc_pyramid);

  // If regular resizing is occurring the source will need to be downscaled to
  // match the upscaled superres resolution. Otherwise the original source is
  // used.
  if (!av1_resize_scaled(cm)) {
    cpi->source = cpi->unscaled_source;
    if (cpi->last_source != NULL) cpi->last_source = cpi->unscaled_last_source;
  } else {
    assert(cpi->unscaled_source->y_crop_width != cm->superres_upscaled_width);
    assert(cpi->unscaled_source->y_crop_height != cm->superres_upscaled_height);
    // Do downscale. cm->(width|height) has been updated by
    // av1_superres_upscale
    cpi->source = realloc_and_scale_source(cpi, cm->superres_upscaled_width,
                                           cm->superres_upscaled_height);
  }
}